

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_ManFindNetworkExactCEGAR(Ses_Man_t *pSes,int nGates,char **pSol)

{
  int iVar1;
  char *pcVar2;
  word *pIn1;
  word local_58;
  word pTruth [4];
  int i;
  int fSat;
  int iMint;
  int fRes;
  char **pSol_local;
  int nGates_local;
  Ses_Man_t *pSes_local;
  
  iVar1 = 4;
  if (10 < nGates) {
    iVar1 = 5;
  }
  Abc_DebugErase(pSes->nDebugOffset + iVar1,pSes->fVeryVerbose);
  Abc_DebugPrintIntInt(" (%d/%d)",nGates,pSes->nMaxGates,pSes->fVeryVerbose);
  iVar1 = Ses_CheckGatesConsistency(pSes,nGates);
  if (iVar1 == 0) {
    pSes_local._4_4_ = 3;
  }
  else {
    for (pTruth[3]._0_4_ = 0; (int)pTruth[3] < pSes->nRandRowAssigns;
        pTruth[3]._0_4_ = (int)pTruth[3] + 1) {
      iVar1 = rand();
      Abc_TtSetBit(pSes->pTtValues,iVar1 % pSes->nRows);
    }
    pSes_local._4_4_ = Ses_ManFindNetworkExact(pSes,nGates);
    if (pSes_local._4_4_ == 1) {
      while( true ) {
        pcVar2 = Ses_ManExtractSolution(pSes);
        *pSol = pcVar2;
        pIn1 = Ses_ManDeriveTruth(pSes,*pSol,0);
        Abc_TtXor(&local_58,pIn1,pSes->pSpec,pSes->nSpecWords,0);
        iVar1 = Abc_TtFindFirstBit(&local_58,pSes->nSpecVars);
        if ((iVar1 == -1) || ((pSes->nSpecVars < 6 && (pSes->nRows < iVar1)))) break;
        if (*pSol != (char *)0x0) {
          free(*pSol);
          *pSol = (char *)0x0;
        }
        if (pSes->fKeepRowAssigns != 0) {
          Abc_TtSetBit(pSes->pTtValues,iVar1 + -1);
        }
        iVar1 = Ses_ManCreateTruthTableClause(pSes,iVar1 + -1);
        if (iVar1 == 0) {
          return 2;
        }
        iVar1 = Ses_ManSolve(pSes);
        if (iVar1 != 1) {
          if (iVar1 != 2) {
            return 2;
          }
          return 0;
        }
        pTruth[3]._4_4_ = 1;
      }
      pSes_local._4_4_ = 1;
    }
  }
  return pSes_local._4_4_;
}

Assistant:

static int Ses_ManFindNetworkExactCEGAR( Ses_Man_t * pSes, int nGates, char ** pSol )
{
    int fRes, iMint, fSat, i;
    word pTruth[4];

    /* debug */
    Abc_DebugErase( pSes->nDebugOffset + ( nGates > 10 ? 5 : 4 ), pSes->fVeryVerbose );
    Abc_DebugPrintIntInt( " (%d/%d)", nGates, pSes->nMaxGates, pSes->fVeryVerbose );

    /* do #gates and max depth allow for a network? */
    if ( !Ses_CheckGatesConsistency( pSes, nGates ) )
        return 3;

    for ( i = 0; i < pSes->nRandRowAssigns; ++i )
        Abc_TtSetBit( pSes->pTtValues, rand() % pSes->nRows );

    fRes = Ses_ManFindNetworkExact( pSes, nGates );
    if ( fRes != 1 ) return fRes;

    while ( true )
    {
        *pSol = Ses_ManExtractSolution( pSes );
        Abc_TtXor( pTruth, Ses_ManDeriveTruth( pSes, *pSol, 0 ), pSes->pSpec, pSes->nSpecWords, 0 );
        iMint = Abc_TtFindFirstBit( pTruth, pSes->nSpecVars );

        if ( iMint == -1 || (pSes->nSpecVars < 6 && iMint > pSes->nRows) )
        {
            assert( fRes == 1 );
            return 1;
        }
        ABC_FREE( *pSol );

        if ( pSes->fKeepRowAssigns )
            Abc_TtSetBit( pSes->pTtValues, iMint - 1 );
        if ( !Ses_ManCreateTruthTableClause( pSes, iMint - 1 ) ) /* UNSAT, continue */
            return 2;

        if ( ( fSat = Ses_ManSolve( pSes ) ) == 1 ) continue;

        return ( fSat == 2 ) ? 0 : 2;
    }
}